

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

void __thiscall Hair_SamplingWeights_Test::TestBody(Hair_SamplingWeights_Test *this)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  BSDFSample *pBVar5;
  char *pcVar6;
  uint64_t a;
  undefined1 auVar7 [16];
  float beta_m;
  Float FVar8;
  anon_struct_4_0_00000001_for___align aVar9;
  Float FVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar12 [64];
  float beta_n;
  Vector3f wo;
  float local_188;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  undefined8 local_168;
  undefined8 local_160;
  SampledWavelengths lambda_1;
  Stratified1DIter __begin5;
  Float avg;
  optional<pbrt::BSDFSample> bs;
  SampledSpectrum sigma_a;
  SampledWavelengths lambda;
  HairBxDF hair;
  undefined1 extraout_var [60];
  
  pbrt::SampledWavelengths::SampleXYZ(&lambda,0.5);
  for (beta_m = 0.1; beta_m < 1.0; beta_m = beta_m + 0.2) {
    for (beta_n = 0.4; beta_n < 1.0; beta_n = beta_n + 0.2) {
      for (a = 0; a != 10000; a = a + 1) {
        FVar8 = pbrt::RadicalInverse(0,a);
        auVar11._0_8_ = (double)FVar8;
        auVar11._8_8_ = extraout_XMM0_Qb;
        auVar7 = vfmadd132sd_fma(auVar11,ZEXT816(0xbff0000000000000),ZEXT816(0x4000000000000000));
        uVar2 = vcmpsd_avx512f(auVar7,ZEXT816(0xbfeffffde7210be9),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        auVar7 = vminsd_avx(ZEXT816(0x3feffffde7210be9),auVar7);
        pbrt::SampledSpectrum::SampledSpectrum(&sigma_a,0.0);
        pbrt::HairBxDF::HairBxDF
                  (&hair,(float)(double)((ulong)bVar3 * -0x4010000218def417 +
                                        (ulong)!bVar3 * auVar7._0_8_),1.55,&sigma_a,beta_m,beta_n,
                   0.0);
        aVar9 = (anon_struct_4_0_00000001_for___align)pbrt::RadicalInverse(1,a);
        bs.optionalValue._4_4_ = pbrt::RadicalInverse(2,a);
        bs.optionalValue.__align = aVar9;
        wo = pbrt::SampleUniformSphere((Point2f *)&bs);
        FVar8 = pbrt::RadicalInverse(3,a);
        FVar10 = pbrt::RadicalInverse(4,a);
        auVar12._0_4_ = pbrt::RadicalInverse(5,a);
        auVar12._4_60_ = extraout_var;
        auVar7._4_4_ = extraout_XMM0_Db;
        auVar7._0_4_ = FVar10;
        auVar7._8_4_ = extraout_XMM0_Dc;
        auVar7._12_4_ = extraout_XMM0_Dd;
        auVar7 = vinsertps_avx(auVar7,auVar12._0_16_,0x10);
        pbrt::HairBxDF::Sample_f(&bs,&hair,wo,FVar8,(Point2f)auVar7._0_8_,Radiance,All);
        if (bs.set == true) {
          local_170.ptr_._0_4_ = 0x14;
          local_168 = 0;
          local_160 = 0x853c49e6748fea9b;
          pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::begin
                    (&__begin5,
                     (IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
                     &local_170);
          pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::end
                    ((Stratified1DIter *)&avg,
                     (IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
                     &local_170);
          local_188 = 0.0;
          for (; (Float)__begin5.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                        super_IndexingIterator<pbrt::detail::Stratified1DIter>.i != avg;
              __begin5.super_RNGIterator<pbrt::detail::Stratified1DIter>.
              super_IndexingIterator<pbrt::detail::Stratified1DIter>.i =
                   __begin5.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                   super_IndexingIterator<pbrt::detail::Stratified1DIter>.i + 1) {
            FVar8 = pbrt::detail::Stratified1DIter::operator*(&__begin5);
            pbrt::SampledWavelengths::SampleXYZ(&lambda_1,FVar8);
            pBVar5 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            FVar8 = pbrt::SampledSpectrum::y(&pBVar5->f,&lambda_1);
            pBVar5 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            fVar1 = (pBVar5->wi).super_Tuple3<pbrt::Vector3,_float>.z;
            pBVar5 = pstd::optional<pbrt::BSDFSample>::value(&bs);
            auVar4._8_4_ = 0x7fffffff;
            auVar4._0_8_ = 0x7fffffff7fffffff;
            auVar4._12_4_ = 0x7fffffff;
            auVar7 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar4);
            local_188 = local_188 + (auVar7._0_4_ * FVar8) / pBVar5->pdf;
          }
          avg = local_188 / 20.0;
          local_170.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x3fefae147ae147ae;
          testing::internal::CmpHelperGT<float,double>
                    ((internal *)&lambda_1,"avg","0.99",(float *)&avg,(double *)&local_170);
          if (lambda_1.lambda.values[0]._0_1_ == '\0') {
            testing::Message::Message((Message *)&local_170);
            pcVar6 = "";
            if (lambda_1.lambda.values._8_8_ != 0) {
              pcVar6 = *(char **)lambda_1.lambda.values._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&__begin5,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
                       ,0x2f2,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&__begin5,(Message *)&local_170);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin5);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_170);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(lambda_1.lambda.values + 2));
          local_170.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x3ff028f5c28f5c29;
          testing::internal::CmpHelperLT<float,double>
                    ((internal *)&lambda_1,"avg","1.01",(float *)&avg,(double *)&local_170);
          if (lambda_1.lambda.values[0]._0_1_ == '\0') {
            testing::Message::Message((Message *)&local_170);
            pcVar6 = "";
            if (lambda_1.lambda.values._8_8_ != 0) {
              pcVar6 = *(char **)lambda_1.lambda.values._8_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&__begin5,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
                       ,0x2f3,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&__begin5,(Message *)&local_170);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin5);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_170);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(lambda_1.lambda.values + 2));
        }
        pstd::optional<pbrt::BSDFSample>::~optional(&bs);
      }
    }
  }
  return;
}

Assistant:

TEST(Hair, SamplingWeights) {
    RNG rng;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);
    for (Float beta_m = .1; beta_m < 1; beta_m += .2)
        for (Float beta_n = .4; beta_n < 1; beta_n += .2) {
            int count = 10000;
            for (int i = 0; i < count; ++i) {
                Float h = Clamp(-1 + 2. * RadicalInverse(0, i), -.999999, .999999);

                // Check _HairBxDF::Sample\_f()_ sample weight
                SampledSpectrum sigma_a(0.);
                HairBxDF hair(h, 1.55, sigma_a, beta_m, beta_n, 0.f);

                Vector3f wo =
                    SampleUniformSphere({RadicalInverse(1, i), RadicalInverse(2, i)});
                Float uc = RadicalInverse(3, i);
                Point2f u = {RadicalInverse(4, i), RadicalInverse(5, i)};
                pstd::optional<BSDFSample> bs = hair.Sample_f(wo, uc, u, TransportMode::Radiance,
                                                              BxDFReflTransFlags::All);
                if (bs) {
                    Float sum = 0;
                    int ny = 20;
                    for (Float u : Stratified1D(ny)) {
                        SampledWavelengths lambda = SampledWavelengths::SampleXYZ(u);
                        sum += bs->f.y(lambda) * AbsCosTheta(bs->wi) / bs->pdf;
                    }

                    // Verify that hair BSDF sample weight is close to 1 for
                    // _wi_
                    Float avg = sum / ny;
                    EXPECT_GT(avg, 0.99);
                    EXPECT_LT(avg, 1.01);
                }
            }
        }
}